

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::TrackAllocCore
          (Recycler *this,void *object,size_t size,TrackAllocData *trackAllocData,bool traceLifetime
          )

{
  long *plVar1;
  int *piVar2;
  long *plVar3;
  type_info *ptVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  code *pcVar7;
  long lVar8;
  bool bVar9;
  TrackerData *pTVar10;
  long lVar11;
  char16_t *form;
  ulong uVar12;
  Recycler *pRVar13;
  undefined8 *in_FS_OFFSET;
  type_info *local_48;
  Recycler *local_40;
  TrackerItem *local_38;
  TrackerItem *item;
  
  ptVar4 = trackAllocData->typeinfo;
  local_48 = ptVar4;
  if (Js::Configuration::Global[0x2c159] == '\x01') {
    TrackFree(this,(char *)object,size);
  }
  pTVar10 = GetTrackerData(this,object);
  if (pTVar10 != (TrackerData *)0x0) {
    pTVar10 = GetTrackerData(this,object);
    if (pTVar10 != &TrackerData::ExplicitFreeListObjectData) {
      AssertCount = AssertCount + 1;
      local_40 = this;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1ffb,
                         "(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData)"
                         ,
                         "GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData"
                        );
      if (!bVar9) goto LAB_002752ba;
      *puVar5 = 0;
      this = local_40;
    }
  }
  if (ptVar4 == (type_info *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1ffc,"(typeInfo != nullptr)","typeInfo != nullptr");
    if (!bVar9) goto LAB_002752ba;
    *puVar5 = 0;
  }
  pRVar6 = (Recycler *)trackAllocData->count;
  uVar12 = size - trackAllocData->plusSize;
  if (pRVar6 == (Recycler *)0xffffffffffffffff) {
    pRVar13 = (Recycler *)&DAT_00000001;
  }
  else {
    uVar12 = uVar12 / (ulong)pRVar6;
    pRVar13 = pRVar6;
  }
  bVar9 = JsUtil::
          BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<std::type_info_const*>
                    ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->trackerDictionary,&local_48,&local_38);
  if (bVar9) {
    local_40 = pRVar13;
    if ((local_38->instanceData).typeinfo != local_48) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2021,"(item->instanceData.typeinfo == typeInfo)",
                         "item->instanceData.typeinfo == typeInfo");
      if (!bVar9) goto LAB_002752ba;
      *puVar5 = 0;
    }
    if ((local_38->instanceData).ItemSize != uVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2022,"(item->instanceData.ItemSize == itemSize)",
                         "item->instanceData.ItemSize == itemSize");
      if (!bVar9) goto LAB_002752ba;
      *puVar5 = 0;
    }
    pRVar13 = local_40;
    if ((local_38->arrayData).ItemSize != uVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2023,"(item->arrayData.ItemSize == itemSize)",
                         "item->arrayData.ItemSize == itemSize");
      if (!bVar9) {
LAB_002752ba:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar5 = 0;
      pRVar13 = local_40;
    }
  }
  else {
    if ((pRVar6 == (Recycler *)0xffffffffffffffff) || (Js::Configuration::Global[0x2c159] == '\0'))
    {
      local_38 = (TrackerItem *)
                 NoCheckHeapAllocator::Alloc
                           ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x90);
      (local_38->instanceData).typeinfo = local_48;
      (local_38->instanceData).isArray = false;
      (local_38->instanceData).TraceLifetime = false;
      (local_38->instanceData).FreeSize = 0;
      (local_38->instanceData).AllocCount = 0;
      (local_38->instanceData).ItemSize = 0;
      (local_38->instanceData).ItemCount = 0;
      (local_38->instanceData).FreeCount = 0;
      (local_38->instanceData).ReqSize = 0;
      (local_38->instanceData).AllocSize = 0;
      (local_38->arrayData).typeinfo = local_48;
      (local_38->arrayData).isArray = true;
      (local_38->arrayData).TraceLifetime = false;
      (local_38->arrayData).FreeSize = 0;
      (local_38->arrayData).AllocCount = 0;
      (local_38->arrayData).ItemSize = 0;
      (local_38->arrayData).ItemCount = 0;
      (local_38->arrayData).FreeCount = 0;
      (local_38->arrayData).ReqSize = 0;
      (local_38->arrayData).AllocSize = 0;
    }
    else {
      local_38 = (TrackerItem *)
                 NoCheckHeapAllocator::Alloc
                           ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x110);
      (local_38->instanceData).typeinfo = local_48;
      (local_38->instanceData).isArray = false;
      (local_38->instanceData).TraceLifetime = false;
      (local_38->instanceData).FreeSize = 0;
      (local_38->instanceData).AllocCount = 0;
      (local_38->instanceData).ItemSize = 0;
      (local_38->instanceData).ItemCount = 0;
      (local_38->instanceData).FreeCount = 0;
      (local_38->instanceData).ReqSize = 0;
      (local_38->instanceData).AllocSize = 0;
      (local_38->arrayData).typeinfo = local_48;
      (local_38->arrayData).isArray = true;
      (local_38->arrayData).TraceLifetime = false;
      (local_38->arrayData).FreeSize = 0;
      (local_38->arrayData).AllocCount = 0;
      (local_38->arrayData).ItemSize = 0;
      (local_38->arrayData).ItemCount = 0;
      (local_38->arrayData).FreeCount = 0;
      (local_38->arrayData).ReqSize = 0;
      (local_38->arrayData).AllocSize = 0;
      StackBackTrace::Capture((char *)(local_38 + 1),0x80,7);
    }
    (local_38->instanceData).ItemSize = uVar12;
    (local_38->arrayData).ItemSize = uVar12;
    JsUtil::
    BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->trackerDictionary,&local_48,&local_38);
  }
  lVar11 = 0x48;
  if (pRVar6 == (Recycler *)0xffffffffffffffff) {
    lVar11 = 0;
  }
  plVar1 = (long *)((long)&(local_38->instanceData).ItemCount + lVar11);
  *plVar1 = (long)((long)&pRVar13->Cookie + *plVar1);
  piVar2 = (int *)((long)&(local_38->instanceData).AllocCount + lVar11);
  *piVar2 = *piVar2 + 1;
  pTVar10 = (TrackerData *)((long)&(local_38->instanceData).typeinfo + lVar11);
  plVar1 = (long *)((long)&(local_38->instanceData).ReqSize + lVar11);
  lVar8 = plVar1[1];
  plVar3 = (long *)((long)&(local_38->instanceData).ReqSize + lVar11);
  *plVar3 = size + *plVar1;
  plVar3[1] = (size + 0xf & 0xfffffffffffffff0) + lVar8;
  (&(local_38->instanceData).TraceLifetime)[lVar11] = traceLifetime;
  if (traceLifetime) {
    form = L"Allocated %S %p\n";
    if (pTVar10->isArray != false) {
      form = L"Allocated %S[] %p\n";
    }
    Output::Print(form,*(char **)(pTVar10->typeinfo + 8) +
                       (**(char **)(pTVar10->typeinfo + 8) == '*'),object);
  }
  SetTrackerData(this,object,pTVar10);
  return;
}

Assistant:

void
Recycler::TrackAllocCore(void * object, size_t size, const TrackAllocData& trackAllocData, bool traceLifetime)
{
    auto&& typeInfo = trackAllocData.GetTypeInfo();
    if (CONFIG_FLAG(KeepRecyclerTrackData))
    {
        TrackFree((char*)object, size);
    }

    Assert(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData);
    Assert(typeInfo != nullptr);
    TrackerItem * item;
    size_t allocCount = trackAllocData.GetCount();
    size_t itemSize = (size - trackAllocData.GetPlusSize());
    bool isArray;
    if (allocCount != (size_t)-1)
    {
        isArray = true;
        itemSize = itemSize / allocCount;
    }
    else
    {
        isArray = false;
        allocCount = 1;
    }

    if (!trackerDictionary->TryGetValue(typeInfo, &item))
    {
#ifdef STACK_BACK_TRACE
        if (CONFIG_FLAG(KeepRecyclerTrackData) && isArray) // type info is not useful record stack instead
        {
            size_t stackTraceSize = 16 * sizeof(void*);
            item = NoCheckHeapNewPlus(stackTraceSize, TrackerItem, typeInfo);
            StackBackTrace::Capture((char*)&item[1], stackTraceSize, 7);
        }
        else
#endif
        {
            item = NoCheckHeapNew(TrackerItem, typeInfo);
        }

        item->instanceData.ItemSize = itemSize;
        item->arrayData.ItemSize = itemSize;
        trackerDictionary->Item(typeInfo, item);
    }
    else
    {
        Assert(item->instanceData.typeinfo == typeInfo);
        Assert(item->instanceData.ItemSize == itemSize);
        Assert(item->arrayData.ItemSize == itemSize);
    }
    TrackerData& data = (isArray)? item->arrayData : item->instanceData;
        data.ItemCount += allocCount;
        data.AllocCount++;
        data.ReqSize += size;
        data.AllocSize += HeapInfo::GetAlignedSizeNoCheck(size);
#ifdef TRACE_OBJECT_LIFETIME
    data.TraceLifetime = traceLifetime;

    if (traceLifetime)
    {
        Output::Print(data.isArray ? _u("Allocated %S[] %p\n") : _u("Allocated %S %p\n"), data.typeinfo->name(), object);
    }
#endif
#ifdef PERF_COUNTERS
    ++data.counter;
    data.sizeCounter += HeapInfo::GetAlignedSizeNoCheck(size);
#endif

    SetTrackerData(object, &data);
}